

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcar(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  undefined4 in_ESI;
  long in_RDI;
  runsdef val;
  uint lstsiz;
  uchar *lstp;
  undefined8 in_stack_ffffffffffffffc8;
  runcxdef *in_stack_ffffffffffffffd0;
  dattyp in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  void *p;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\a') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  p = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  iVar2 = osrp2(p);
  if (iVar2 + -2 == 0) {
    runpush((runcxdef *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
            (runsdef *)in_stack_ffffffffffffffd0);
  }
  else {
    runpbuf((runcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
            (int)((ulong)((long)p + 2) >> 0x20),
            (void *)CONCAT44(iVar2 + -2,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void bifcar(bifcxdef *ctx, int argc)
{
    uchar   *lstp;
    uint     lstsiz;
    runsdef  val;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_LIST);
    
    lstp = runpoplst(ctx->bifcxrun);
    
    /* get list's size, and point to its data string */
    lstsiz = osrp2(lstp) - 2;
    lstp += 2;
    
    /* push first element if one is present, otherwise push nil */
    if (lstsiz)
        runpbuf(ctx->bifcxrun, *lstp, lstp+1);
    else
        runpush(ctx->bifcxrun, DAT_NIL, &val);
}